

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O1

void __thiscall
stackjit::Loader::Function::Function
          (Function *this,string *name,string *returnType,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,bool isExternal)

{
  pointer pcVar1;
  
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->mReturnType)._M_dataplus._M_p = (pointer)&(this->mReturnType).field_2;
  pcVar1 = (returnType->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mReturnType,pcVar1,pcVar1 + returnType->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mParameters,parameters);
  this->mIsMemberFunction = false;
  (this->mClassName)._M_dataplus._M_p = (pointer)&(this->mClassName).field_2;
  (this->mClassName)._M_string_length = 0;
  (this->mClassName).field_2._M_local_buf[0] = '\0';
  (this->mMemberFunctionName)._M_dataplus._M_p = (pointer)&(this->mMemberFunctionName).field_2;
  (this->mMemberFunctionName)._M_string_length = 0;
  (this->mMemberFunctionName).field_2._M_local_buf[0] = '\0';
  this->mIsExternal = isExternal;
  (this->mInstructions).
  super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mInstructions).
  super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mInstructions).
  super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mLocalTypes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mLocalTypes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mLocalTypes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mAttributes)._M_h._M_buckets = &(this->mAttributes)._M_h._M_single_bucket;
  (this->mAttributes)._M_h._M_bucket_count = 1;
  (this->mAttributes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mAttributes)._M_h._M_element_count = 0;
  (this->mAttributes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mAttributes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mAttributes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Loader::Function::Function(std::string name, std::string returnType, const std::vector<std::string>& parameters, bool isExternal)
			: mName(name),
			  mReturnType(returnType),
			  mParameters(parameters),
			  mIsMemberFunction(false),
			  mIsExternal(isExternal) {

	}